

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_avx2.c
# Opt level: O0

void sse_sum_wd4_avx2(int16_t *data,int stride,int bh,int *x_sum,int64_t *x2_sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i regx2_sum_00;
  __m256i regx_sum_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int in_EDX;
  int in_ESI;
  ulong *in_RDI;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int j;
  __m256i one;
  int16_t *data_tmp;
  __m256i row_sse_buffer;
  __m256i row_sum_buffer;
  __m256i temp_buffer2;
  __m256i temp_buffer1;
  __m256i sse_buffer;
  __m256i sum_buffer;
  __m256i load_pixels;
  __m256i regx2_sum;
  __m256i regx_sum;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  undefined4 local_5e4;
  undefined8 local_5a8;
  int64_t *in_stack_fffffffffffffa68;
  int *in_stack_fffffffffffffa70;
  undefined8 in_stack_fffffffffffffa78;
  undefined8 in_stack_fffffffffffffa80;
  undefined8 in_stack_fffffffffffffa88;
  longlong in_stack_fffffffffffffa90;
  undefined8 in_stack_fffffffffffffa98;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 uStack_3b8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar1 = vpinsrw_avx(auVar1,1,2);
  auVar1 = vpinsrw_avx(auVar1,1,3);
  auVar1 = vpinsrw_avx(auVar1,1,4);
  auVar1 = vpinsrw_avx(auVar1,1,5);
  auVar1 = vpinsrw_avx(auVar1,1,6);
  auVar1 = vpinsrw_avx(auVar1,1,7);
  auVar8 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar8 = vpinsrw_avx(auVar8,1,2);
  auVar8 = vpinsrw_avx(auVar8,1,3);
  auVar8 = vpinsrw_avx(auVar8,1,4);
  auVar8 = vpinsrw_avx(auVar8,1,5);
  auVar8 = vpinsrw_avx(auVar8,1,6);
  auVar8 = vpinsrw_avx(auVar8,1,7);
  uStack_70 = auVar8._0_8_;
  uStack_68 = auVar8._8_8_;
  uStack_3b8 = SUB328(ZEXT832(0),4);
  local_500 = ZEXT832(uStack_3b8) << 0x40;
  local_520 = ZEXT832(uStack_3b8) << 0x40;
  local_5a8 = in_RDI;
  for (local_5e4 = 0; local_5e4 < in_EDX >> 2; local_5e4 = local_5e4 + 1) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *local_5a8;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)((long)local_5a8 + (long)in_ESI * 2);
    auVar8 = vpunpcklqdq_avx(auVar5,auVar8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)((long)local_5a8 + (long)(in_ESI * 2) * 2);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)((long)local_5a8 + (long)(in_ESI * 3) * 2);
    auVar9 = vpunpcklqdq_avx(auVar4,auVar9);
    auVar8 = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar8;
    auVar9 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar9;
    uStack_4d0 = auVar9._0_8_;
    uStack_4c8 = auVar9._8_8_;
    auVar7._16_8_ = uStack_4d0;
    auVar7._0_16_ = auVar8;
    auVar7._24_8_ = uStack_4c8;
    auVar2._16_8_ = uStack_70;
    auVar2._0_16_ = auVar1;
    auVar2._24_8_ = uStack_68;
    auVar2 = vpmaddwd_avx2(auVar7,auVar2);
    in_stack_fffffffffffffa80 = auVar2._0_8_;
    in_stack_fffffffffffffa88 = auVar2._8_8_;
    in_stack_fffffffffffffa90 = auVar2._16_8_;
    in_stack_fffffffffffffa98 = auVar2._24_8_;
    auVar6._16_8_ = uStack_4d0;
    auVar6._0_16_ = auVar8;
    auVar6._24_8_ = uStack_4c8;
    auVar3._16_8_ = uStack_4d0;
    auVar3._0_16_ = auVar8;
    auVar3._24_8_ = uStack_4c8;
    auVar3 = vpmaddwd_avx2(auVar6,auVar3);
    in_stack_fffffffffffffa68 = auVar3._8_8_;
    in_stack_fffffffffffffa70 = auVar3._16_8_;
    in_stack_fffffffffffffa78 = auVar3._24_8_;
    local_500 = vpaddd_avx2(auVar2,local_500);
    local_520 = vpaddd_avx2(auVar3,local_520);
    local_5a8 = (ulong *)((long)local_5a8 + (long)(in_ESI << 2) * 2);
  }
  auVar2 = vpunpckldq_avx2(local_520,ZEXT1632(ZEXT816(0)));
  auVar3 = vpunpckhdq_avx2(local_520,ZEXT1632(ZEXT816(0)));
  auVar2 = vpaddq_avx2(auVar2,auVar3);
  vpaddd_avx2(local_500,ZEXT1632(ZEXT816(0)));
  vpaddq_avx2(auVar2,ZEXT1632(ZEXT816(0)));
  regx_sum_00[1] = auVar3._0_8_;
  regx_sum_00[0] = in_stack_fffffffffffffa98;
  regx_sum_00[2] = auVar3._8_8_;
  regx_sum_00[3] = auVar3._16_8_;
  regx2_sum_00[1] = in_stack_fffffffffffffa80;
  regx2_sum_00[0] = in_stack_fffffffffffffa78;
  regx2_sum_00[2] = in_stack_fffffffffffffa88;
  regx2_sum_00[3] = in_stack_fffffffffffffa90;
  accumulate_sse_sum(regx_sum_00,regx2_sum_00,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  return;
}

Assistant:

static inline void sse_sum_wd4_avx2(const int16_t *data, int stride, int bh,
                                    int *x_sum, int64_t *x2_sum) {
  __m128i row1, row2, row3;
  __m256i regx_sum, regx2_sum, load_pixels, sum_buffer, sse_buffer,
      temp_buffer1, temp_buffer2, row_sum_buffer, row_sse_buffer;
  const int16_t *data_tmp = data;
  __m256i one = _mm256_set1_epi16(1);
  regx_sum = _mm256_setzero_si256();
  regx2_sum = regx_sum;
  sum_buffer = _mm256_setzero_si256();
  sse_buffer = sum_buffer;

  for (int j = 0; j < (bh >> 2); ++j) {
    // Load 4 rows at a time.
    row1 = _mm_loadl_epi64((__m128i const *)(data_tmp));
    row2 = _mm_loadl_epi64((__m128i const *)(data_tmp + stride));
    row1 = _mm_unpacklo_epi64(row1, row2);
    row2 = _mm_loadl_epi64((__m128i const *)(data_tmp + 2 * stride));
    row3 = _mm_loadl_epi64((__m128i const *)(data_tmp + 3 * stride));
    row2 = _mm_unpacklo_epi64(row2, row3);
    load_pixels =
        _mm256_insertf128_si256(_mm256_castsi128_si256(row1), row2, 1);

    row_sum_buffer = _mm256_madd_epi16(load_pixels, one);
    row_sse_buffer = _mm256_madd_epi16(load_pixels, load_pixels);
    sum_buffer = _mm256_add_epi32(row_sum_buffer, sum_buffer);
    sse_buffer = _mm256_add_epi32(row_sse_buffer, sse_buffer);
    data_tmp += 4 * stride;
  }

  // To prevent 32-bit variable overflow, unpack the elements to 64-bit.
  temp_buffer1 = _mm256_unpacklo_epi32(sse_buffer, _mm256_setzero_si256());
  temp_buffer2 = _mm256_unpackhi_epi32(sse_buffer, _mm256_setzero_si256());
  sse_buffer = _mm256_add_epi64(temp_buffer1, temp_buffer2);
  regx_sum = _mm256_add_epi32(sum_buffer, regx_sum);
  regx2_sum = _mm256_add_epi64(sse_buffer, regx2_sum);

  accumulate_sse_sum(regx_sum, regx2_sum, x_sum, x2_sum);
}